

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# send_message.cpp
# Opt level: O0

void pstore::brokerface::send_message(writer *wr,bool error_on_timeout,czstring verb,czstring path)

{
  ulong uVar1;
  ushort nump;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __first;
  long lVar2;
  long *plVar3;
  size_t __n;
  message_type local_1a0;
  long local_a0;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_98;
  iterator last;
  difference_type local_80;
  difference_type remaining;
  iterator iStack_70;
  num_parts_type part;
  iterator first;
  uint32_t mid;
  num_parts_type num_parts;
  allocator local_49;
  string local_48 [8];
  string payload;
  czstring path_local;
  czstring verb_local;
  bool error_on_timeout_local;
  writer *wr_local;
  
  if (verb == (czstring)0x0) {
    assert_failed("verb != nullptr",
                  "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/lib/brokerface/send_message.cpp"
                  ,0x25);
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_48,verb,&local_49);
  std::allocator<char>::~allocator((allocator<char> *)&local_49);
  if ((path != (czstring)0x0) && (*path != '\0')) {
    std::__cxx11::string::append((char *)local_48);
    std::__cxx11::string::append((char *)local_48);
  }
  lVar2 = std::__cxx11::string::length();
  uVar1 = (lVar2 + 0xf3U) / 0xf4;
  nump = (ushort)uVar1;
  first._M_current._4_4_ =
       std::__atomic_base<unsigned_int>::operator++
                 ((__atomic_base<unsigned_int> *)&(anonymous_namespace)::message_id,0);
  iStack_70 = std::begin<std::__cxx11::string>
                        ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_48);
  remaining._6_2_ = 0;
  while( true ) {
    __first._M_current = iStack_70._M_current;
    if (nump <= remaining._6_2_) {
      std::__cxx11::string::~string(local_48);
      return;
    }
    last = std::end<std::__cxx11::string>
                     ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_48)
    ;
    local_80 = std::distance<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>>
                         (__first,(__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                   )last._M_current);
    if (local_80 < 1) break;
    local_98._M_current = iStack_70._M_current;
    local_a0 = 0xf4;
    plVar3 = std::min<long>(&local_80,&local_a0);
    std::advance<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,long>(&local_98,*plVar3);
    __n = uVar1 & 0xffff;
    message_type::message_type<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>>
              (&local_1a0,first._M_current._4_4_,remaining._6_2_,nump,
               (__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                )iStack_70._M_current,local_98);
    writer::write(wr,(int)&local_1a0,(void *)(ulong)(error_on_timeout & 1),__n);
    iStack_70._M_current = local_98._M_current;
    remaining._6_2_ = remaining._6_2_ + 1;
  }
  assert_failed("remaining > 0",
                "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/lib/brokerface/send_message.cpp"
                ,0x41);
}

Assistant:

void send_message (writer & wr, bool const error_on_timeout, gsl::czstring const verb,
                           gsl::czstring const path) {
            PSTORE_ASSERT (verb != nullptr);

            auto payload = std::string{verb};
            if (path != nullptr && path[0] != '\0') {
                payload.append (" ");
                payload.append (path);
            }

            // Work out the number of pieces into which we need to break this payload.
            using num_parts_type = std::remove_const<decltype (message_type::num_parts)>::type;
            auto const num_parts =
                static_cast<num_parts_type> ((payload.length () + message_type::payload_chars - 1) /
                                             message_type::payload_chars);

            std::uint32_t const mid = message_id++;

            // Build and send each message.
            auto first = std::begin (payload);

            using difference_type = std::iterator_traits<decltype (first)>::difference_type;
            static_assert (message_type::payload_chars <=
                               static_cast<std::make_unsigned<difference_type>::type> (
                                   std::numeric_limits<difference_type>::max ()),
                           "payload_chars is too large to be represented as "
                           "string::iterator::difference_type");

            for (auto part = num_parts_type{0}; part < num_parts; ++part) {
                auto const remaining = std::distance (first, std::end (payload));
                PSTORE_ASSERT (remaining > 0);

                auto last = first;
                std::advance (last, std::min (remaining, static_cast<difference_type> (
                                                             message_type::payload_chars)));

                wr.write (message_type{mid, part, num_parts, first, last}, error_on_timeout);
                first = last;
            }
        }